

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  bool bVar1;
  CameraBase *this_00;
  float *in_RCX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  undefined1 auVar8 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  Vector3f VVar11;
  Point3f PVar12;
  Point3<float> PVar13;
  Bounds2f BVar14;
  Float lensArea;
  Bounds2f sampleBounds;
  Point3f pRaster;
  Point3f pCamera;
  Point3f pFocus;
  Point3<float> *in_stack_000000e0;
  Float cosTheta;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  float v;
  float local_f8;
  undefined8 in_stack_ffffffffffffff10;
  Float time;
  Point3f *p;
  Float in_stack_ffffffffffffff3c;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff40;
  Point3f local_3c;
  Tuple3<pbrt::Vector3,_float> local_30;
  float local_24;
  float *local_20;
  float *local_18;
  undefined8 local_10;
  undefined1 auVar10 [56];
  
  time = (Float)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  this_00 = (CameraBase *)(in_RSI + 0xc);
  p = &local_3c;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0.0);
  auVar8 = (undefined1  [56])0x0;
  VVar11 = CameraBase::RenderFromCamera(this_00,(Vector3f *)p,time);
  local_30.z = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar8;
  local_30._0_8_ = vmovlpd_avx(auVar3._0_16_);
  local_24 = Dot<float>((Vector3<float> *)this_00,(Vector3<float> *)&local_30);
  if (*(float *)(in_RDI + 0x5a0) < local_24) {
    auVar10 = SUB6056((undefined1  [60])0x0,4);
    auVar8 = ZEXT856(0);
    PVar12 = Ray::operator()((Ray *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    auVar4._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar8;
    vmovlpd_avx(auVar4._0_16_);
    auVar8 = (undefined1  [56])0x0;
    PVar12 = CameraBase::CameraFromRender(this_00,p,local_10._4_4_);
    auVar5._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar8;
    vmovlpd_avx(auVar5._0_16_);
    PVar13 = Transform::ApplyInverse<float>((Transform *)pdfDir,in_stack_000000e0);
    auVar6._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar8;
    vmovlpd_avx(auVar6._0_16_);
    BVar14 = FilmHandle::SampleBounds
                       ((FilmHandle *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
    auVar9._0_8_ = BVar14.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar9._8_56_ = auVar10;
    auVar7._0_8_ = BVar14.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar7._8_56_ = auVar8;
    vmovlpd_avx(auVar7._0_16_);
    vmovlpd_avx(auVar9._0_16_);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    bVar1 = Inside<float>((Point2<float> *)&stack0xffffffffffffff38,
                          (Bounds2<float> *)&stack0xffffffffffffff40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((*(float *)(in_RDI + 0x580) != 0.0) || (NAN(*(float *)(in_RDI + 0x580)))) {
        local_f8 = *(float *)(in_RDI + 0x580) * 3.1415927 * *(float *)(in_RDI + 0x580);
      }
      else {
        local_f8 = 1.0;
      }
      *local_18 = 1.0 / local_f8;
      v = *(float *)(in_RDI + 0x5a4);
      fVar2 = Pow<3>(v);
      *local_20 = 1.0 / (v * fVar2);
    }
    else {
      *local_20 = 0.0;
      *local_18 = 0.0;
    }
  }
  else {
    *local_20 = 0.0;
    *local_18 = 0.0;
  }
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}